

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refresh.c
# Opt level: O0

void re_clear_lines(EditLine *el)

{
  wchar_t local_14;
  wchar_t i;
  EditLine *el_local;
  
  if (((el->el_terminal).t_flags & 4U) == 0) {
    terminal_move_to_line(el,(el->el_refresh).r_oldcv);
    terminal__putc(el,0xd);
    terminal__putc(el,10);
  }
  else {
    for (local_14 = (el->el_refresh).r_oldcv; L'\xffffffff' < local_14;
        local_14 = local_14 + L'\xffffffff') {
      terminal_move_to_line(el,local_14);
      terminal_move_to_char(el,L'\0');
      terminal_clear_EOL(el,(el->el_terminal).t_size.h);
    }
  }
  return;
}

Assistant:

libedit_private void
re_clear_lines(EditLine *el)
{

	if (EL_CAN_CEOL) {
		int i;
		for (i = el->el_refresh.r_oldcv; i >= 0; i--) {
			/* for each line on the screen */
			terminal_move_to_line(el, i);
			terminal_move_to_char(el, 0);
			terminal_clear_EOL(el, el->el_terminal.t_size.h);
		}
	} else {
		terminal_move_to_line(el, el->el_refresh.r_oldcv);
					/* go to last line */
		terminal__putc(el, '\r');	/* go to BOL */
		terminal__putc(el, '\n');	/* go to new line */
	}
}